

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void WhiteOnRedBold(void)

{
  std::operator<<((ostream *)&std::cout,"\x1b[41m\x1b[1;37m");
  return;
}

Assistant:

void WhiteOnRedBold()
{
#ifdef _WIN32
	auto h = WinColor();
	SetConsoleTextAttribute(h, BACKGROUND_RED | FOREGROUND_RED | FOREGROUND_GREEN | FOREGROUND_BLUE | FOREGROUND_INTENSITY);
#else
	std::cout << "\033[41m\033[1;37m";
#endif
}